

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O1

bool __thiscall TRM::TGAImage::write_tga_file(TGAImage *this,char *filename,bool rle)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  uchar extension_area_ref [4];
  uchar developer_area_ref [4];
  uchar footer [18];
  TGAHeader header;
  ofstream out;
  undefined4 local_260;
  undefined4 local_25c;
  char local_258 [32];
  ulong local_238;
  long lStack_230;
  char local_228;
  undefined1 uStack_227;
  long local_220;
  filebuf local_218 [24];
  int aiStack_200 [54];
  ios_base local_128 [264];
  
  local_25c = 0;
  local_260 = 0;
  builtin_strncpy(local_258,"TRUEVISION-XFILE.",0x12);
  std::ofstream::ofstream(&local_220);
  std::ofstream::open((char *)&local_220,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1262c8);
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::ofstream::close();
  }
  else {
    lStack_230 = (ulong)CONCAT22((short)this->height,(short)this->width) << 0x20;
    local_238 = (ulong)(byte)(rle * '\b' | this->bytespp == 1) << 0x10 | 0x20000;
    _local_228 = CONCAT11(0x20,(char)this->bytespp * '\b');
    std::ostream::write((char *)&local_220,(long)&local_238);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
      if (rle) {
        bVar2 = unload_rle_data(this,(ofstream *)&local_220);
        if (!bVar2) {
          std::ofstream::close();
          lVar4 = 0x16;
          pcVar5 = "can\'t unload rle data\n";
          goto LAB_0011a2a5;
        }
LAB_0011a3a1:
        std::ostream::write((char *)&local_220,(long)&local_25c);
        lVar4 = 0x18;
        pcVar5 = "can\'t dump the tga file\n";
        if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
          std::ostream::write((char *)&local_220,(long)&local_260);
          if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
            std::ostream::write((char *)&local_220,(long)local_258);
            if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
              bVar2 = true;
              std::ofstream::close();
              goto LAB_0011a437;
            }
          }
        }
      }
      else {
        std::ostream::write((char *)&local_220,(long)this->data);
        if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) goto LAB_0011a3a1;
        lVar4 = 0x16;
        pcVar5 = "can\'t unload raw data\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
      std::ofstream::close();
    }
    else {
      std::ofstream::close();
      lVar4 = 0x18;
      pcVar5 = "can\'t dump the tga file\n";
LAB_0011a2a5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    }
  }
  bVar2 = false;
LAB_0011a437:
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return bVar2;
}

Assistant:

bool TGAImage::write_tga_file(const char *filename, bool rle) {
  unsigned char developer_area_ref[4] = {0, 0, 0, 0};
  unsigned char extension_area_ref[4] = {0, 0, 0, 0};
  unsigned char footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                              'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
  std::ofstream out;
  out.open(filename, std::ios::binary);
  if (!out.is_open()) {
    std::cerr << "can't open file " << filename << "\n";
    out.close();
    return false;
  }
  TGAHeader header;
  memset((void *)&header, 0, sizeof(header));
  header.bitsperpixel = bytespp << 3;
  header.width = width;
  header.height = height;
  header.datatypecode =
      (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
  header.imagedescriptor = 0x20;  // top-left origin
  out.write((char *)&header, sizeof(header));
  if (!out.good()) {
    out.close();
    std::cerr << "can't dump the tga file\n";
    return false;
  }
  if (!rle) {
    out.write((char *)data, width * height * bytespp);
    if (!out.good()) {
      std::cerr << "can't unload raw data\n";
      out.close();
      return false;
    }
  } else {
    if (!unload_rle_data(out)) {
      out.close();
      std::cerr << "can't unload rle data\n";
      return false;
    }
  }
  out.write((char *)developer_area_ref, sizeof(developer_area_ref));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.write((char *)extension_area_ref, sizeof(extension_area_ref));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.write((char *)footer, sizeof(footer));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.close();
  return true;
}